

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restoration.c
# Opt level: O1

void filter_frame_on_unit
               (RestorationTileLimits *limits,int rest_unit_idx,void *priv,int32_t *tmpbuf,
               RestorationLineBuffers *rlbs,aom_internal_error_info *error_info)

{
  long lVar1;
  
  lVar1 = *priv;
  av1_loop_restoration_filter_unit
            (limits,(RestorationUnitInfo *)((long)rest_unit_idx * 0x40 + *(long *)(lVar1 + 0x18)),
             (RestorationStripeBoundaries *)(lVar1 + 0x20),rlbs,(int)tmpbuf,
             *(int *)((long)priv + 0x14),*(int *)((long)priv + 8),*(int *)((long)priv + 0xc),
             *(int *)((long)priv + 0x18),*(int *)((long)priv + 0x1c),
             *(uint8_t **)((long)priv + 0x20),*(int *)((long)priv + 0x30),
             *(uint8_t **)((long)priv + 0x28),*(int *)((long)priv + 0x34),tmpbuf,
             *(int *)(lVar1 + 0x38),error_info);
  return;
}

Assistant:

static void filter_frame_on_unit(const RestorationTileLimits *limits,
                                 int rest_unit_idx, void *priv, int32_t *tmpbuf,
                                 RestorationLineBuffers *rlbs,
                                 struct aom_internal_error_info *error_info) {
  FilterFrameCtxt *ctxt = (FilterFrameCtxt *)priv;
  const RestorationInfo *rsi = ctxt->rsi;

  av1_loop_restoration_filter_unit(
      limits, &rsi->unit_info[rest_unit_idx], &rsi->boundaries, rlbs,
      ctxt->plane_w, ctxt->plane_h, ctxt->ss_x, ctxt->ss_y, ctxt->highbd,
      ctxt->bit_depth, ctxt->data8, ctxt->data_stride, ctxt->dst8,
      ctxt->dst_stride, tmpbuf, rsi->optimized_lr, error_info);
}